

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O1

bool __thiscall smf::MidiFile::readSmf(MidiFile *this,string *filename)

{
  char cVar1;
  bool bVar2;
  fstream input;
  istream local_230 [528];
  
  this->m_timemapvalid = false;
  setFilename(this,filename);
  this->m_rwstatus = true;
  std::fstream::fstream(local_230);
  std::fstream::open((char *)local_230,(_Ios_Openmode)(filename->_M_dataplus)._M_p);
  cVar1 = std::__basic_file<char>::is_open();
  bVar2 = false;
  if (cVar1 != '\0') {
    bVar2 = readSmf(this,local_230);
  }
  this->m_rwstatus = bVar2;
  std::fstream::~fstream(local_230);
  return bVar2;
}

Assistant:

bool MidiFile::readSmf(const std::string& filename) {
	m_timemapvalid = 0;
	setFilename(filename);
	m_rwstatus = true;

	std::fstream input;
	input.open(filename.c_str(), std::ios::binary | std::ios::in);

	if (!input.is_open()) {
		m_rwstatus = false;
		return m_rwstatus;
	}

	m_rwstatus = readSmf(input);
	return m_rwstatus;
}